

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int async_func_init(JSContext *ctx,JSAsyncFunctionState *s,JSValue func_obj,JSValue this_obj,
                   int argc,JSValue *argv)

{
  list_head *plVar1;
  int *piVar2;
  undefined8 uVar3;
  int iVar4;
  JSValue *pJVar5;
  uint uVar6;
  long lVar7;
  JSValueUnion JVar8;
  ulong uVar9;
  long lVar10;
  JSValueUnion JVar11;
  uint uVar12;
  
  JVar11 = this_obj.u;
  JVar8 = func_obj.u;
  plVar1 = &(s->frame).var_ref_list;
  (s->frame).var_ref_list.prev = plVar1;
  (s->frame).var_ref_list.next = plVar1;
  lVar7 = *(long *)((long)JVar8.ptr + 0x30);
  (s->frame).js_mode = (uint)*(byte *)(lVar7 + 0x18);
  (s->frame).cur_pc = *(uint8_t **)(lVar7 + 0x20);
  uVar12 = (uint)*(ushort *)(lVar7 + 0x40);
  if ((int)(uint)*(ushort *)(lVar7 + 0x40) <= argc) {
    uVar12 = argc;
  }
  uVar6 = (uint)*(ushort *)(lVar7 + 0x46) + (uint)*(ushort *)(lVar7 + 0x42) + uVar12;
  uVar9 = 1;
  if (1 < (int)uVar6) {
    uVar9 = (ulong)uVar6;
  }
  pJVar5 = (JSValue *)js_malloc(ctx,uVar9 << 4);
  (s->frame).arg_buf = pJVar5;
  if (pJVar5 == (JSValue *)0x0) {
    iVar4 = -1;
  }
  else {
    if (0xfffffff4 < (uint)func_obj.tag) {
      *(int *)JVar8.ptr = *JVar8.ptr + 1;
    }
    (s->frame).cur_func.u.ptr = (void *)JVar8;
    (s->frame).cur_func.tag = func_obj.tag;
    if (0xfffffff4 < (uint)this_obj.tag) {
      *(int *)JVar11.ptr = *JVar11.ptr + 1;
    }
    (s->this_val).u.ptr = (void *)JVar11;
    (s->this_val).tag = this_obj.tag;
    s->argc = argc;
    (s->frame).arg_count = uVar12;
    (s->frame).var_buf = pJVar5 + uVar12;
    (s->frame).cur_sp = pJVar5 + uVar12 + *(ushort *)(lVar7 + 0x42);
    if (0 < argc) {
      lVar10 = 0;
      do {
        pJVar5 = (s->frame).arg_buf;
        piVar2 = *(int **)((long)&argv->u + lVar10);
        uVar3 = *(undefined8 *)((long)&argv->tag + lVar10);
        if (0xfffffff4 < (uint)uVar3) {
          *piVar2 = *piVar2 + 1;
        }
        *(int **)((long)&pJVar5->u + lVar10) = piVar2;
        *(undefined8 *)((long)&pJVar5->tag + lVar10) = uVar3;
        lVar10 = lVar10 + 0x10;
      } while ((ulong)(uint)argc << 4 != lVar10);
    }
    iVar4 = 0;
    if (argc < (int)(uVar12 + *(ushort *)(lVar7 + 0x42))) {
      lVar7 = ((ulong)uVar12 + (ulong)*(ushort *)(lVar7 + 0x42)) - (long)argc;
      uVar9 = (long)argc << 4 | 8;
      do {
        pJVar5 = (s->frame).arg_buf;
        *(undefined4 *)((long)pJVar5 + (uVar9 - 8)) = 0;
        *(undefined8 *)((long)&pJVar5->u + uVar9) = 3;
        uVar9 = uVar9 + 0x10;
        lVar7 = lVar7 + -1;
        iVar4 = 0;
      } while (lVar7 != 0);
    }
  }
  return iVar4;
}

Assistant:

static __exception int async_func_init(JSContext *ctx, JSAsyncFunctionState *s,
                                       JSValueConst func_obj, JSValueConst this_obj,
                                       int argc, JSValueConst *argv)
{
    JSObject *p;
    JSFunctionBytecode *b;
    JSStackFrame *sf;
    int local_count, i, arg_buf_len, n;

    sf = &s->frame;
    init_list_head(&sf->var_ref_list);
    p = JS_VALUE_GET_OBJ(func_obj);
    b = p->u.func.function_bytecode;
    sf->js_mode = b->js_mode;
    sf->cur_pc = b->byte_code_buf;
    arg_buf_len = max_int(b->arg_count, argc);
    local_count = arg_buf_len + b->var_count + b->stack_size;
    sf->arg_buf = js_malloc(ctx, sizeof(JSValue) * max_int(local_count, 1));
    if (!sf->arg_buf)
        return -1;
    sf->cur_func = JS_DupValue(ctx, func_obj);
    s->this_val = JS_DupValue(ctx, this_obj);
    s->argc = argc;
    sf->arg_count = arg_buf_len;
    sf->var_buf = sf->arg_buf + arg_buf_len;
    sf->cur_sp = sf->var_buf + b->var_count;
    for(i = 0; i < argc; i++)
        sf->arg_buf[i] = JS_DupValue(ctx, argv[i]);
    n = arg_buf_len + b->var_count;
    for(i = argc; i < n; i++)
        sf->arg_buf[i] = JS_UNDEFINED;
    return 0;
}